

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * Lowerer::GetMissingItemOpnd(IRType type,Func *func)

{
  IRType type_00;
  char cVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  AddrOpnd *pAVar5;
  IntConstOpnd *pIVar6;
  Opnd *compareSrc1;
  undefined4 *puVar7;
  BranchInstr *pBVar8;
  LabelInstr *in_RCX;
  OpCode branchOpCode;
  undefined7 in_register_00000039;
  undefined8 *puVar9;
  char *this;
  Instr *in_R8;
  
  puVar9 = (undefined8 *)CONCAT71(in_register_00000039,type);
  if ((int)puVar9 == 3) {
    pIVar6 = IR::IntConstOpnd::New(-0x7fffe,TyInt32,func,true);
    return &pIVar6->super_Opnd;
  }
  if ((int)puVar9 == 0x17) {
    pAVar5 = IR::AddrOpnd::New(&DAT_40002fff80002,AddrOpndKindConstantAddress,func,true,(Var)0x0);
    return &pAVar5->super_Opnd;
  }
  GetMissingItemOpnd();
  type_00 = *(IRType *)((long)&func->m_runtimeInfo + 2);
  this = (char *)(ulong)type_00;
  compareSrc1 = GetMissingItemOpndForCompare(type_00,(Func *)*puVar9);
  cVar1 = *(char *)((long)&func->m_runtimeInfo + 2);
  if ((cVar1 != '\x03') && (cVar1 != '\x17')) {
    if (cVar1 == '\n') {
      OVar3 = IR::Opnd::GetKind((Opnd *)func);
      if (OVar3 != OpndKindReg) {
        OVar3 = IR::Opnd::GetKind((Opnd *)func);
        if (OVar3 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x465c,"(compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd())",
                             "compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd()");
          if (!bVar4) goto LAB_005d7987;
          *puVar7 = 0;
        }
      }
      pBVar8 = LowererMD::InsertMissingItemCompareBranch
                         ((LowererMD *)(puVar9 + 1),(Opnd *)func,compareSrc1,branchOpCode,in_RCX,
                          in_R8);
      return (Opnd *)pBVar8;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    this = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4661,"(compareSrc->IsInt32() || compareSrc->IsVar())",
                       "compareSrc->IsInt32() || compareSrc->IsVar()");
    if (!bVar4) {
LAB_005d7987:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pBVar8 = InsertCompareBranch((Lowerer *)this,compareSrc1,(Opnd *)func,branchOpCode,false,in_RCX,
                               in_R8,true);
  return (Opnd *)pBVar8;
}

Assistant:

IR::Opnd *
Lowerer::GetMissingItemOpnd(IRType type, Func *func)
{
    if (type == TyVar)
    {
        return IR::AddrOpnd::New(Js::JavascriptArray::MissingItem, IR::AddrOpndKindConstantAddress, func, true);
    }
    if (type == TyInt32)
    {
        return IR::IntConstOpnd::New(Js::JavascriptNativeIntArray::MissingItem, TyInt32, func, true);
    }
    AssertMsg(false, "Only expecting TyVar and TyInt32 in Lowerer::GetMissingItemOpnd");
    __assume(false);
}